

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.hpp
# Opt level: O0

bool CoreML::Specification::operator==
               (RepeatedField<unsigned_long> *a,RepeatedField<unsigned_long> *b)

{
  unsigned_long uVar1;
  int iVar2;
  int iVar3;
  unsigned_long *puVar4;
  int local_24;
  int i;
  RepeatedField<unsigned_long> *b_local;
  RepeatedField<unsigned_long> *a_local;
  
  iVar2 = google::protobuf::RepeatedField<unsigned_long>::size(a);
  iVar3 = google::protobuf::RepeatedField<unsigned_long>::size(b);
  if (iVar2 == iVar3) {
    for (local_24 = 0; iVar2 = google::protobuf::RepeatedField<unsigned_long>::size(a),
        local_24 < iVar2; local_24 = local_24 + 1) {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::operator[](a,local_24);
      uVar1 = *puVar4;
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::operator[](b,local_24);
      if (uVar1 != *puVar4) {
        return false;
      }
    }
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const ::google::protobuf::RepeatedField<T>& a,
                        const ::google::protobuf::RepeatedField<T>& b) {
            if (a.size() != b.size()) {
                return false;
            }
            for (int i=0; i<a.size(); i++) {
                if (a[i] != b[i]) {
                    return false;
                }
            }
            return true;
        }